

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-transpose-array.h
# Opt level: O2

int transpose_array(coda_cursor *cursor,void *array,int element_size)

{
  int iVar1;
  long lVar2;
  void *__src;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t __size;
  int num_dims;
  long rsub [9];
  long multiplier [9];
  long rdim [9];
  long dim [8];
  
  iVar1 = coda_cursor_get_array_dim(cursor,&num_dims,dim);
  if (iVar1 == 0) {
    lVar2 = (long)num_dims;
    iVar1 = 0;
    if (1 < lVar2) {
      uVar3 = (ulong)(num_dims - 1);
      lVar7 = 1;
      for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
        lVar7 = lVar7 * dim[lVar4];
        rsub[lVar4] = 0;
        rdim[lVar4] = dim[uVar3];
        uVar3 = uVar3 - 1;
      }
      iVar1 = 0;
      if (1 < lVar7) {
        lVar4 = 1;
        multiplier[lVar2] = 1;
        rdim[lVar2] = 1;
        for (lVar5 = lVar2; 0 < lVar5; lVar5 = lVar5 + -1) {
          lVar4 = lVar4 * rdim[lVar5];
          multiplier[lVar5 + -1] = lVar4;
        }
        rdim[lVar2] = 0;
        rsub[lVar2] = 0;
        __size = (ulong)(uint)element_size * lVar7;
        __src = malloc(__size);
        if (__src == (void *)0x0) {
          iVar1 = -1;
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-transpose-array.h"
                         ,0x5d);
        }
        else {
          switch(element_size) {
          case 1:
            lVar2 = 0;
            for (lVar4 = 0; lVar4 != lVar7; lVar4 = lVar4 + 1) {
              *(undefined1 *)((long)__src + lVar2) = *(undefined1 *)((long)array + lVar4);
              lVar2 = lVar2 + multiplier[0];
              lVar5 = rsub[0] + 1;
              rsub[0] = lVar5;
              for (lVar6 = 0; lVar5 == *(long *)((long)rdim + lVar6); lVar6 = lVar6 + 8) {
                *(undefined8 *)((long)rsub + lVar6) = 0;
                lVar2 = (lVar2 + *(long *)((long)multiplier + lVar6 + 8)) -
                        lVar5 * *(long *)((long)multiplier + lVar6);
                lVar5 = *(long *)((long)rsub + lVar6 + 8) + 1;
                *(long *)((long)rsub + lVar6 + 8) = lVar5;
              }
            }
            break;
          case 2:
            lVar2 = 0;
            for (lVar4 = 0; lVar4 != lVar7; lVar4 = lVar4 + 1) {
              *(undefined2 *)((long)__src + lVar2 * 2) = *(undefined2 *)((long)array + lVar4 * 2);
              lVar2 = lVar2 + multiplier[0];
              lVar5 = rsub[0] + 1;
              rsub[0] = lVar5;
              for (lVar6 = 0; lVar5 == *(long *)((long)rdim + lVar6); lVar6 = lVar6 + 8) {
                *(undefined8 *)((long)rsub + lVar6) = 0;
                lVar2 = (lVar2 + *(long *)((long)multiplier + lVar6 + 8)) -
                        lVar5 * *(long *)((long)multiplier + lVar6);
                lVar5 = *(long *)((long)rsub + lVar6 + 8) + 1;
                *(long *)((long)rsub + lVar6 + 8) = lVar5;
              }
            }
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-transpose-array.h"
                          ,0xac,"int transpose_array(const coda_cursor *, void *, int)");
          case 4:
            lVar2 = 0;
            for (lVar4 = 0; lVar4 != lVar7; lVar4 = lVar4 + 1) {
              *(undefined4 *)((long)__src + lVar2 * 4) = *(undefined4 *)((long)array + lVar4 * 4);
              lVar2 = lVar2 + multiplier[0];
              lVar5 = rsub[0] + 1;
              rsub[0] = lVar5;
              for (lVar6 = 0; lVar5 == *(long *)((long)rdim + lVar6); lVar6 = lVar6 + 8) {
                *(undefined8 *)((long)rsub + lVar6) = 0;
                lVar2 = (lVar2 + *(long *)((long)multiplier + lVar6 + 8)) -
                        lVar5 * *(long *)((long)multiplier + lVar6);
                lVar5 = *(long *)((long)rsub + lVar6 + 8) + 1;
                *(long *)((long)rsub + lVar6 + 8) = lVar5;
              }
            }
            break;
          case 8:
            lVar2 = 0;
            for (lVar4 = 0; lVar4 != lVar7; lVar4 = lVar4 + 1) {
              *(undefined8 *)((long)__src + lVar2 * 8) = *(undefined8 *)((long)array + lVar4 * 8);
              lVar2 = lVar2 + multiplier[0];
              lVar5 = rsub[0] + 1;
              rsub[0] = lVar5;
              for (lVar6 = 0; lVar5 == *(long *)((long)rdim + lVar6); lVar6 = lVar6 + 8) {
                *(undefined8 *)((long)rsub + lVar6) = 0;
                lVar2 = (lVar2 + *(long *)((long)multiplier + lVar6 + 8)) -
                        lVar5 * *(long *)((long)multiplier + lVar6);
                lVar5 = *(long *)((long)rsub + lVar6 + 8) + 1;
                *(long *)((long)rsub + lVar6 + 8) = lVar5;
              }
            }
          }
          memcpy(array,__src,__size);
          free(__src);
        }
      }
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int transpose_array(const coda_cursor *cursor, void *array, int element_size)
{
    long dim[CODA_MAX_NUM_DIMS];
    int num_dims;
    long num_elements;
    long multiplier[CODA_MAX_NUM_DIMS + 1];
    long rsub[CODA_MAX_NUM_DIMS + 1];   /* reversed index in multi dim array */
    long rdim[CODA_MAX_NUM_DIMS + 1];   /* reversed order of dim[] */
    long index = 0;
    long i;
    uint8_t *src;
    uint8_t *dst;

    if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
    {
        return -1;
    }

    if (num_dims <= 1)
    {
        /* nothing to do */
        return 0;
    }

    src = (uint8_t *)array;

    num_elements = 1;
    for (i = 0; i < num_dims; i++)
    {
        num_elements *= dim[i];
        rsub[i] = 0;
        rdim[i] = dim[num_dims - 1 - i];
    }
    if (num_elements <= 1)
    {
        /* nothing to do */
        return 0;
    }

    multiplier[num_dims] = 1;
    rdim[num_dims] = 1;
    for (i = num_dims; i > 0; i--)
    {
        multiplier[i - 1] = multiplier[i] * rdim[i];
    }
    rdim[num_dims] = 0;
    rsub[num_dims] = 0;

    dst = (uint8_t *)malloc(num_elements * element_size);
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       num_elements * element_size, __FILE__, __LINE__);
        return -1;
    }

    switch (element_size)
    {
        case 1:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                dst[index] = src[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 2:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint16_t *)dst)[index] = ((uint16_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 4:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint32_t *)dst)[index] = ((uint32_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 8:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint64_t *)dst)[index] = ((uint64_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    memcpy(array, dst, num_elements * element_size);

    free(dst);

    return 0;
}